

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

int32 Func::AdjustOffsetValue(int32 offset)

{
  int32 offset_local;
  
  return offset + -0x10;
}

Assistant:

int32
Func::AdjustOffsetValue(int32 offset)
{
#ifdef MD_GROW_LOCALS_AREA_UP
        return -(offset + BailOutInfo::StackSymBias);
#else
        // Stack offset are negative, includes the PUSH EBP and return address
        return offset - (2 * MachPtr);
#endif
}